

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

ssize_t __thiscall Packet::read(Packet *this,int __fd,void *__buf,size_t __nbytes)

{
  uint *puVar1;
  pointer pcVar2;
  size_t sVar3;
  ulong extraout_RAX;
  ulong uVar4;
  undefined4 in_register_00000034;
  basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *this_00;
  uint uVar5;
  uint uVar6;
  vector<char,_std::allocator<char>_> extras;
  _Vector_base<char,_std::allocator<char>_> local_50;
  uint *local_38;
  long local_30;
  
  this_00 = (basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             *)CONCAT44(in_register_00000034,__fd);
  if (0 < (long)this->ext_len) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_50,(long)this->ext_len,
               (allocator_type *)&local_38);
    for (uVar5 = 0; uVar5 < (uint)this->ext_len; uVar5 = uVar5 + (int)sVar3) {
      local_30 = (long)local_50._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_50._M_impl.super__Vector_impl_data._M_start;
      local_38 = (uint *)0x0;
      if (local_30 != 0) {
        local_38 = (uint *)local_50._M_impl.super__Vector_impl_data._M_start;
      }
      sVar3 = boost::asio::
              basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              ::receive<boost::asio::mutable_buffers_1>(this_00,(mutable_buffers_1 *)&local_38);
    }
    if (4 < (ulong)((long)local_50._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_50._M_impl.super__Vector_impl_data._M_start)) {
      uVar5 = *(uint *)local_50._M_impl.super__Vector_impl_data._M_start;
      this->flags = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_50);
  }
  if ((ulong)this->key_len == 0) {
    uVar4 = 0;
  }
  else {
    std::vector<char,_std::allocator<char>_>::resize(&this->key,(ulong)this->key_len);
    for (uVar5 = 0; uVar4 = (ulong)this->key_len, uVar5 < this->key_len; uVar5 = uVar5 + (int)sVar3)
    {
      puVar1 = (uint *)(this->key).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      local_50._M_impl.super__Vector_impl_data._M_finish =
           (this->key).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish + -(long)puVar1;
      local_50._M_impl.super__Vector_impl_data._M_start = (pointer)(uint *)0x0;
      if (local_50._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        local_50._M_impl.super__Vector_impl_data._M_start = (pointer)puVar1;
      }
      sVar3 = boost::asio::
              basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              ::receive<boost::asio::mutable_buffers_1>(this_00,(mutable_buffers_1 *)&local_50);
    }
  }
  if ((uint)uVar4 < this->bod_len) {
    uVar6 = this->bod_len - ((uint)uVar4 + this->ext_len);
    std::vector<char,_std::allocator<char>_>::resize(&this->val,(ulong)uVar6);
    uVar4 = extraout_RAX;
    for (uVar5 = 0; uVar5 < uVar6; uVar5 = uVar5 + (int)uVar4) {
      pcVar2 = (this->val).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_50._M_impl.super__Vector_impl_data._M_finish =
           (this->val).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish + -(long)pcVar2;
      local_50._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      if (local_50._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        local_50._M_impl.super__Vector_impl_data._M_start = pcVar2;
      }
      uVar4 = boost::asio::
              basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              ::receive<boost::asio::mutable_buffers_1>(this_00,(mutable_buffers_1 *)&local_50);
    }
  }
  return uVar4;
}

Assistant:

void Packet::read(socket& socket) {
  std::uint32_t bytes_read = 0;

  if (ext_len > 0) {
    std::vector<char> extras(ext_len);
    while (bytes_read < static_cast<std::uint32_t>(ext_len)) {
      bytes_read += socket.receive(boost::asio::buffer(extras));
    }
    bytes_read = 0;

    if (extras.size() > 4) {
      char flags_buf[4] = { extras[0], extras[1], extras[2], extras[3] };
      flags = readUInt32LE(flags_buf, 0);
    }
  }

  if (key_len > 0) {
    key.resize(key_len);
    while (bytes_read < key_len) {
      bytes_read += socket.receive(boost::asio::buffer(key));
    }
    bytes_read = 0;
  }

  if (bod_len > key_len) {
    std::uint32_t val_len = bod_len - key_len - ext_len;
    val.resize(val_len);
    while (bytes_read < val_len) {
      bytes_read += socket.receive(boost::asio::buffer(val));
    }
  }
}